

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

qcc_uint qcc_stream_get(qcc_stream *self)

{
  qcc_uint qVar1;
  qcc_uint result;
  qcc_stream *self_local;
  
  if (self->is_writing == 0) {
    if (self->node == (qcc_stream_node *)0x0) {
      self->is_overrun = 1;
    }
    if (self->is_overrun != 0) {
      return 0;
    }
  }
  else {
    _generate_data(self);
  }
  qcc_stream_begin(self);
  qVar1 = self->node->value;
  self->node = self->node->next;
  qcc_stream_end(self);
  return qVar1;
}

Assistant:

qcc_uint qcc_stream_get(struct qcc_stream *self)
{
    if (self->is_writing)
        _generate_data(self);
    else
    {
        if (!self->node) self->is_overrun = 1;
        if (self->is_overrun) return 0;
    }

    qcc_stream_begin(self);
    qcc_uint result = self->node->value;
    self->node = self->node->next;
    qcc_stream_end(self);
    return result;
}